

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void __thiscall de::cmdline::detail::Parser::help(Parser *this,ostream *str)

{
  const_iterator cVar1;
  bool bVar2;
  reference pOVar3;
  ostream *poVar4;
  char *pcVar5;
  void *local_38;
  void *curValue;
  OptInfo *opt;
  __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
  local_20;
  const_iterator optIter;
  ostream *str_local;
  Parser *this_local;
  
  optIter._M_current = (OptInfo *)str;
  local_20._M_current =
       (OptInfo *)
       std::
       vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
       ::begin(&this->m_options);
  while( true ) {
    opt = (OptInfo *)
          std::
          vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
          ::end(&this->m_options);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
                        *)&opt);
    if (!bVar2) break;
    pOVar3 = __gnu_cxx::
             __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
             ::operator*(&local_20);
    std::operator<<((ostream *)optIter._M_current,"  ");
    if (pOVar3->shortName != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)optIter._M_current,"-");
      std::operator<<(poVar4,pOVar3->shortName);
    }
    if ((pOVar3->shortName != (char *)0x0) && (pOVar3->longName != (char *)0x0)) {
      std::operator<<((ostream *)optIter._M_current,", ");
    }
    if (pOVar3->longName != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)optIter._M_current,"--");
      std::operator<<(poVar4,pOVar3->longName);
    }
    if (pOVar3->namedValues == (void *)0x0) {
      if ((pOVar3->isFlag & 1U) == 0) {
        std::operator<<((ostream *)optIter._M_current,"=<value>");
      }
    }
    else {
      std::operator<<((ostream *)optIter._M_current,"=[");
      for (local_38 = pOVar3->namedValues; local_38 != pOVar3->namedValuesEnd;
          local_38 = (void *)((long)local_38 + pOVar3->namedValueStride)) {
        if (local_38 != pOVar3->namedValues) {
          std::operator<<((ostream *)optIter._M_current,"|");
        }
        cVar1._M_current = optIter._M_current;
        pcVar5 = getNamedValueName(local_38);
        std::operator<<((ostream *)cVar1._M_current,pcVar5);
      }
      std::operator<<((ostream *)optIter._M_current,"]");
    }
    std::operator<<((ostream *)optIter._M_current,"\n");
    if (pOVar3->description != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)optIter._M_current,"    ");
      poVar4 = std::operator<<(poVar4,pOVar3->description);
      std::operator<<(poVar4,"\n");
    }
    if (pOVar3->defaultValue != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)optIter._M_current,"    default: \'");
      poVar4 = std::operator<<(poVar4,pOVar3->defaultValue);
      std::operator<<(poVar4,"\'\n");
    }
    std::operator<<((ostream *)optIter._M_current,"\n");
    __gnu_cxx::
    __normal_iterator<const_de::cmdline::detail::Parser::OptInfo_*,_std::vector<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Parser::help (std::ostream& str) const
{
	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); ++optIter)
	{
		const OptInfo& opt = *optIter;

		str << "  ";
		if (opt.shortName)
			str << "-" << opt.shortName;

		if (opt.shortName && opt.longName)
			str << ", ";

		if (opt.longName)
			str << "--" << opt.longName;

		if (opt.namedValues)
		{
			str << "=[";

			for (const void* curValue = opt.namedValues; curValue != opt.namedValuesEnd; curValue = (const void*)((deUintptr)curValue + opt.namedValueStride))
			{
				if (curValue != opt.namedValues)
					str << "|";
				str << getNamedValueName(curValue);
			}

			str << "]";
		}
		else if (!opt.isFlag)
			str << "=<value>";

		str << "\n";

		if (opt.description)
			str << "    " << opt.description << "\n";

		if (opt.defaultValue)
			str << "    default: '" << opt.defaultValue << "'\n";

		str << "\n";
	}
}